

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::
write_significand<char,fmt::v11::basic_appender<char>,unsigned_int,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,uint significand,int significand_size,int exponent,
          digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  basic_appender<char> bVar1;
  memory_buffer buffer;
  char local_231;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> local_230;
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    bVar1 = format_decimal<char,_unsigned_int,_fmt::v11::basic_appender<char>,_0>
                      (out,significand,significand_size);
    local_230.super_buffer<char>.ptr_._0_1_ = 0x30;
    bVar1 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar1,exponent,(char *)&local_230);
  }
  else {
    local_230.super_buffer<char>.size_ = 0;
    local_230.super_buffer<char>.grow_ =
         basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_230.super_buffer<char>.ptr_._0_1_ = SUB81(local_230.store_,0);
    local_230.super_buffer<char>.ptr_._1_7_ = (undefined7)((ulong)local_230.store_ >> 8);
    local_230.super_buffer<char>.capacity_ = 500;
    format_decimal<char,_unsigned_int,_fmt::v11::basic_appender<char>,_0>
              (&local_230.super_buffer<char>,significand,significand_size);
    local_231 = '0';
    fill_n<fmt::v11::basic_appender<char>,int,char>
              (&local_230.super_buffer<char>,exponent,&local_231);
    digits.data_._1_7_ = local_230.super_buffer<char>.ptr_._1_7_;
    digits.data_._0_1_ = local_230.super_buffer<char>.ptr_._0_1_;
    digits.size_ = local_230.super_buffer<char>.size_;
    bVar1 = digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&local_230);
  }
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}